

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int pager_fill_page(Pager *pPager,pgno iNum,void *pContents)

{
  sxu32 sVar1;
  Page *pPVar2;
  
  if (pPager->nPage != 0) {
    for (pPVar2 = pPager->apHash[(uint)iNum & pPager->nSize - 1]; pPVar2 != (Page *)0x0;
        pPVar2 = pPVar2->pNextCollide) {
      if (pPVar2->pgno == iNum) goto LAB_001174e7;
    }
  }
  pPVar2 = (Page *)0x0;
LAB_001174e7:
  if (pPVar2 != (Page *)0x0) {
    sVar1 = SyMemcpy(pContents,pPVar2->zData,pPager->iPageSize);
    return sVar1;
  }
  return 0;
}

Assistant:

static Page * pager_fetch_page(Pager *pPager,pgno page_num)
{
	Page *pEntry;
	if( pPager->nPage < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	/* Perform the lookup */
	pEntry = pPager->apHash[PAGE_HASH(page_num) & (pPager->nSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->pgno == page_num ){
			return pEntry;
		}
		/* Point to the next entry in the colission chain */
		pEntry = pEntry->pNextCollide;
	}
	/* No such page */
	return 0;
}